

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usertimer.cpp
# Opt level: O3

time_t __thiscall soplex::UserTimer::time(UserTimer *this,time_t *__timer)

{
  clock_t cVar1;
  tms local_28;
  
  if ((this->super_Timer).status == RUNNING) {
    cVar1 = times(&local_28);
    if ((int)cVar1 == -1) {
      local_28.tms_utime = 0;
    }
    this->uTicks = local_28.tms_utime;
    local_28.tms_utime = local_28.tms_utime + this->uAccount;
  }
  else {
    local_28.tms_utime = this->uAccount;
  }
  this->lasttime = (((double)local_28.tms_utime * 1000.0) / (double)ticks_per_sec) / 1000.0;
  return local_28.tms_utime;
}

Assistant:

Real UserTimer::time() const
{
   if(status == RUNNING)
   {
      updateTicks();
      lasttime = ticks2sec(uTicks + uAccount);
   }
   else
   {
      lasttime = ticks2sec(uAccount);
   }

   return lasttime;
}